

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void prepare_half_coeffs_4tap_ssse3
               (InterpFilterParams *filter_params,int32_t subpel_q4,__m128i *coeffs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*in_RDX) [16];
  uint in_ESI;
  InterpFilterParams *in_RDI;
  __m128i coeffs_1;
  __m128i coeffs_8;
  int16_t *filter;
  
  pauVar3 = (undefined1 (*) [16])av1_get_interp_filter_subpel_kernel(in_RDI,in_ESI & 0xf);
  auVar2 = vpsraw_avx(*pauVar3,ZEXT416(1));
  auVar1 = vpinsrw_avx(ZEXT216(0x604),0x604,1);
  auVar1 = vpinsrw_avx(auVar1,0x604,2);
  auVar1 = vpinsrw_avx(auVar1,0x604,3);
  auVar1 = vpinsrw_avx(auVar1,0x604,4);
  auVar1 = vpinsrw_avx(auVar1,0x604,5);
  auVar1 = vpinsrw_avx(auVar1,0x604,6);
  auVar1 = vpinsrw_avx(auVar1,0x604,7);
  auVar1 = vpshufb_avx(auVar2,auVar1);
  *in_RDX = auVar1;
  auVar1 = vpinsrw_avx(ZEXT216(0xa08),0xa08,1);
  auVar1 = vpinsrw_avx(auVar1,0xa08,2);
  auVar1 = vpinsrw_avx(auVar1,0xa08,3);
  auVar1 = vpinsrw_avx(auVar1,0xa08,4);
  auVar1 = vpinsrw_avx(auVar1,0xa08,5);
  auVar1 = vpinsrw_avx(auVar1,0xa08,6);
  auVar1 = vpinsrw_avx(auVar1,0xa08,7);
  auVar1 = vpshufb_avx(auVar2,auVar1);
  in_RDX[1] = auVar1;
  return;
}

Assistant:

static inline void prepare_half_coeffs_4tap_ssse3(
    const InterpFilterParams *const filter_params, const int32_t subpel_q4,
    __m128i *const coeffs /* [2] */) {
  const int16_t *const filter = av1_get_interp_filter_subpel_kernel(
      filter_params, subpel_q4 & SUBPEL_MASK);
  const __m128i coeffs_8 = _mm_loadu_si128((__m128i *)filter);

  // right shift all filter co-efficients by 1 to reduce the bits required.
  // This extra right shift will be taken care of at the end while rounding
  // the result.
  // Since all filter co-efficients are even, this change will not affect the
  // end result
  assert(_mm_test_all_zeros(_mm_and_si128(coeffs_8, _mm_set1_epi16(1)),
                            _mm_set1_epi16((short)0xffff)));

  const __m128i coeffs_1 = _mm_srai_epi16(coeffs_8, 1);

  // coeffs 2 3 2 3 2 3 2 3
  coeffs[0] = _mm_shuffle_epi8(coeffs_1, _mm_set1_epi16(0x0604u));
  // coeffs 4 5 4 5 4 5 4 5
  coeffs[1] = _mm_shuffle_epi8(coeffs_1, _mm_set1_epi16(0x0a08u));
}